

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

void __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::deinit(InputVariablesCannotBeModifiedTest *this)

{
  GLuint *pGVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  uint n_so_id_ptr;
  long lVar3;
  GLuint *so_id_ptrs [5];
  GLuint *local_58 [6];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_58[0] = &this->m_fs_id;
  local_58[1] = &this->m_gs_id;
  local_58[2] = &this->m_tc_id;
  local_58[3] = &this->m_te_id;
  local_58[4] = &this->m_vs_id;
  lVar3 = 0;
  do {
    pGVar1 = local_58[lVar3];
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x470))(*pGVar1);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"glDeleteShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x11f);
    *pGVar1 = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

void InputVariablesCannotBeModifiedTest::deinit()
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLuint*		  so_id_ptrs[] = {
		&m_fs_id, &m_gs_id, &m_tc_id, &m_te_id, &m_vs_id,
	};
	const unsigned int n_so_id_ptrs = static_cast<const unsigned int>(sizeof(so_id_ptrs) / sizeof(so_id_ptrs[0]));

	for (unsigned int n_so_id_ptr = 0; n_so_id_ptr < n_so_id_ptrs; ++n_so_id_ptr)
	{
		gl.deleteShader(*so_id_ptrs[n_so_id_ptr]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");

		*so_id_ptrs[n_so_id_ptr] = 0;
	} /* for (all created shader objects) */
}